

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

int CBB_did_write(CBB *cbb,size_t len)

{
  cbb_buffer_st *pcVar1;
  ulong uVar2;
  size_t newlen;
  cbb_buffer_st *base;
  size_t len_local;
  CBB *cbb_local;
  
  pcVar1 = cbb_get_base(cbb);
  uVar2 = pcVar1->len + len;
  if (((cbb->child == (CBB *)0x0) && (pcVar1->len <= uVar2)) && (uVar2 <= pcVar1->cap)) {
    pcVar1->len = uVar2;
    cbb_local._4_4_ = 1;
  }
  else {
    cbb_local._4_4_ = 0;
  }
  return cbb_local._4_4_;
}

Assistant:

int CBB_did_write(CBB *cbb, size_t len) {
  struct cbb_buffer_st *base = cbb_get_base(cbb);
  size_t newlen = base->len + len;
  if (cbb->child != NULL || newlen < base->len || newlen > base->cap) {
    return 0;
  }
  base->len = newlen;
  return 1;
}